

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Decode
          (Minefield_Data_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *V;
  pointer puVar1;
  pointer pMVar2;
  pointer pMVar3;
  iterator __position;
  bool bVar4;
  vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *pvVar5;
  KBOOL KVar6;
  KUINT8 KVar7;
  KUINT16 KVar8;
  KException *this_00;
  short sVar9;
  int iVar10;
  undefined7 in_register_00000011;
  Minefield_Data_PDU *pMVar11;
  ushort uVar12;
  _func_int **pp_Var13;
  byte bVar14;
  short sVar15;
  ushort uVar16;
  uint uVar17;
  pointer pMVar18;
  long lVar19;
  byte bVar20;
  char cVar21;
  ulong uVar22;
  KUINT8 *pKVar23;
  KUINT8 ui8Tmp;
  KUINT8 ui8Pad;
  KUINT16 ui16SnsTyp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vNumVerts;
  KUINT16 ui16Pad;
  vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> vVerts;
  byte local_18a;
  KUOCTET local_189;
  KUINT8 *local_188;
  MinefieldDataFilter *local_180;
  unsigned_short local_172;
  vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *local_170;
  undefined1 local_168 [16];
  uchar *local_158;
  Minefield_Data_PDU *local_150;
  ulong local_148;
  undefined1 local_140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [13];
  vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> local_60;
  Vector local_48;
  
  KVar8 = KDataStream::GetBufferSize(stream);
  iVar10 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar10 = 0;
  }
  if (0x2b < iVar10 + (uint)KVar8) {
    puVar1 = (this->m_vui16SensorTypes).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui16SensorTypes).
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    pMVar2 = (this->m_vMines).
             super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar3 = (this->m_vMines).
             super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pMVar18 = pMVar2;
    if (pMVar3 != pMVar2) {
      do {
        (**(pMVar18->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase)(pMVar18);
        pMVar18 = pMVar18 + 1;
      } while (pMVar18 != pMVar3);
      (this->m_vMines).
      super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar2;
    }
    Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
    (*(this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ReqID,stream);
    KDataStream::Read<unsigned_short>(stream,&(this->m_SeqNumUnion).m_ui16SeqNum);
    KDataStream::Read(stream,&this->m_ui8ReqID);
    KDataStream::Read(stream,&this->m_ui8PduSeqNum);
    KDataStream::Read(stream,&this->m_ui8NumPdus);
    pKVar23 = &this->m_ui8NumMines;
    KDataStream::Read(stream,pKVar23);
    V = &this->m_ui8NumSensTyp;
    KDataStream::Read(stream,V);
    KDataStream::Read(stream,&this->m_ui8Padding1);
    local_180 = &this->m_DataFilter;
    (*(this->m_DataFilter).super_DataTypeBase._vptr_DataTypeBase[3])(local_180,stream);
    (*(this->m_MineTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MineTyp);
    local_172 = 0;
    local_188 = pKVar23;
    if (this->m_ui8NumSensTyp != '\0') {
      bVar14 = 0;
      do {
        KDataStream::Read<unsigned_short>(stream,&local_172);
        __position._M_current =
             (this->m_vui16SensorTypes).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vui16SensorTypes).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                     &this->m_vui16SensorTypes,__position,&local_172);
        }
        else {
          *__position._M_current = local_172;
          (this->m_vui16SensorTypes).
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pKVar23 = local_188;
        bVar14 = bVar14 + 1;
      } while (bVar14 < *V);
      if ((*V & 1) != 0) {
        local_140._0_8_ = local_140._0_8_ & 0xffffffffffff0000;
        KDataStream::Read<unsigned_short>(stream,(unsigned_short *)local_140);
      }
    }
    local_170 = &this->m_vMines;
    local_150 = this;
    if (*pKVar23 != 0) {
      bVar14 = 0;
      do {
        DATA_TYPE::Mine::Mine((Mine *)local_140);
        DATA_TYPE::Vector::Vector((Vector *)local_168,stream);
        DATA_TYPE::Mine::SetLocation((Mine *)local_140,(Vector *)local_168);
        DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_168);
        std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::push_back
                  (local_170,(Mine *)local_140);
        DATA_TYPE::Mine::~Mine((Mine *)local_140);
        bVar14 = bVar14 + 1;
      } while (bVar14 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsGroundBurialDepthOffset(local_180);
    pvVar5 = local_170;
    if ((KVar6) && (*pKVar23 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)local_140);
        DATA_TYPE::Mine::SetGroundBurialDepthOffsetValue
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),(KFLOAT32)local_140._0_4_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsWaterBurialDepthOffset(local_180);
    if ((KVar6) && (*pKVar23 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)local_140);
        DATA_TYPE::Mine::SetWaterBurialDepthOffsetValue
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),(KFLOAT32)local_140._0_4_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsSnowBurialDepthOffset(local_180);
    if ((KVar6) && (*pKVar23 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)local_140);
        DATA_TYPE::Mine::SetSnowBurialDepthOffsetValue
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),(KFLOAT32)local_140._0_4_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsMineOrientation(local_180);
    if ((KVar6) && (*local_188 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        pMVar2 = (local_170->
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        DATA_TYPE::EulerAngles::EulerAngles((EulerAngles *)local_140,stream);
        DATA_TYPE::Mine::SetMineOrientationValue
                  ((Mine *)((long)&(pMVar2->super_MinefieldDataFilter).super_DataTypeBase.
                                   _vptr_DataTypeBase + lVar19),(EulerAngles *)local_140);
        DATA_TYPE::EulerAngles::~EulerAngles((EulerAngles *)local_140);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *local_188);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsThermalContrast(local_180);
    pvVar5 = local_170;
    pKVar23 = local_188;
    if ((KVar6) && (*local_188 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)local_140);
        DATA_TYPE::Mine::SetThermalContrastValue
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),(KFLOAT32)local_140._0_4_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsReflectance(local_180);
    if ((KVar6) && (*pKVar23 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)local_140);
        DATA_TYPE::Mine::SetReflectanceValue
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),(KFLOAT32)local_140._0_4_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsMineEmplacementAge(local_180);
    bVar14 = *pKVar23;
    if (bVar14 != 0 && KVar6) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        pMVar2 = (local_170->
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        DATA_TYPE::ClockTime::ClockTime((ClockTime *)local_140,stream);
        DATA_TYPE::Mine::SetMineEmplacementAgeValue
                  ((Mine *)((long)&(pMVar2->super_MinefieldDataFilter).super_DataTypeBase.
                                   _vptr_DataTypeBase + lVar19),(ClockTime *)local_140);
        DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_140);
        uVar22 = uVar22 + 1;
        bVar14 = *local_188;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < bVar14);
    }
    pvVar5 = local_170;
    pKVar23 = local_188;
    if (bVar14 != 0) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        KDataStream::Read<unsigned_short>(stream,(unsigned_short *)local_140);
        DATA_TYPE::Mine::SetID
                  ((Mine *)((long)&(((pvVar5->
                                     super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase
                           + lVar19),local_140._0_2_);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *pKVar23);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsFusing(local_180);
    if ((KVar6) && (*local_188 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        pMVar2 = (local_170->
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        DATA_TYPE::MineFusing::MineFusing((MineFusing *)local_140,stream);
        DATA_TYPE::Mine::SetFusingValue
                  ((Mine *)((long)&(pMVar2->super_MinefieldDataFilter).super_DataTypeBase.
                                   _vptr_DataTypeBase + lVar19),(MineFusing *)local_140);
        DATA_TYPE::MineFusing::~MineFusing((MineFusing *)local_140);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *local_188);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsScalarDetectionCoefficient(local_180);
    bVar14 = *local_188;
    if (bVar14 != 0 && KVar6) {
      bVar20 = *V;
      uVar22 = 0;
      do {
        pvVar5 = local_170;
        if (bVar20 == 0) {
          bVar20 = 0;
        }
        else {
          bVar14 = 0;
          local_148 = uVar22;
          do {
            local_140._0_8_ = local_140._0_8_ & 0xffffffffffffff00;
            KDataStream::Read(stream,local_140);
            DATA_TYPE::Mine::AddScalarDetectionCoefficientValue
                      ((pvVar5->
                       super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar22,(KUINT8)local_140[0]);
            bVar14 = bVar14 + 1;
            bVar20 = *V;
          } while (bVar14 < bVar20);
          bVar14 = *local_188;
          uVar22 = local_148;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < bVar14);
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsPaintScheme(local_180);
    pvVar5 = local_170;
    if ((KVar6) && (*local_188 != 0)) {
      lVar19 = 0;
      uVar22 = 0;
      do {
        pMVar2 = (pvVar5->
                 super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        DATA_TYPE::MinePaintScheme::MinePaintScheme((MinePaintScheme *)local_140,stream);
        DATA_TYPE::Mine::SetPaintSchemeValue
                  ((Mine *)((long)&(pMVar2->super_MinefieldDataFilter).super_DataTypeBase.
                                   _vptr_DataTypeBase + lVar19),(MinePaintScheme *)local_140);
        DATA_TYPE::MinePaintScheme::~MinePaintScheme((MinePaintScheme *)local_140);
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0xe0;
      } while (uVar22 < *local_188);
    }
    KVar7 = calcPaddingPaintScheme(local_150);
    local_189 = '\0';
    if (KVar7 != '\0') {
      do {
        KDataStream::Read(stream,&local_189);
        KVar7 = KVar7 + 0xff;
      } while (KVar7 != '\0');
    }
    KVar6 = DATA_TYPE::MinefieldDataFilter::IsTripDetonationWire(local_180);
    pKVar23 = local_188;
    if (KVar6) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_140,
                 (ulong)*local_188,(allocator_type *)local_168);
      local_18a = 0;
      if (*pKVar23 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        bVar14 = 0;
        do {
          KDataStream::Read(stream,&local_18a);
          bVar20 = local_18a;
          if (local_140._8_8_ == local_130[0]._M_allocated_capacity) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_140,
                       (iterator)local_140._8_8_,&local_18a);
          }
          else {
            *(byte *)local_140._8_8_ = local_18a;
            local_140._8_8_ = local_140._8_8_ + 1;
          }
          uVar12 = bVar20 + uVar12;
          bVar14 = bVar14 + 1;
          bVar20 = *local_188;
        } while (bVar14 < bVar20);
        sVar15 = 4 - (ushort)bVar20;
        sVar9 = 7 - (ushort)bVar20;
        if (-1 < sVar15) {
          sVar9 = sVar15;
        }
        bVar14 = (byte)sVar9 & 0xfc;
        pKVar23 = local_188;
        if ((byte)sVar15 != bVar14) {
          bVar20 = 0;
          do {
            KDataStream::Read(stream,&local_189);
            bVar20 = bVar20 + 1;
            pKVar23 = local_188;
          } while (bVar20 < (byte)((byte)sVar15 - bVar14));
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,(ulong)uVar12,
                 (allocator_type *)&local_60);
      if (uVar12 != 0) {
        uVar16 = 1;
        do {
          KDataStream::Read(stream,&local_18a);
          if ((uchar *)local_168._8_8_ == local_158) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_168,
                       (iterator)local_168._8_8_,&local_18a);
          }
          else {
            *(byte *)local_168._8_8_ = local_18a;
            local_168._8_8_ = local_168._8_8_ + 1;
          }
          bVar4 = uVar16 < uVar12;
          uVar16 = (ushort)(byte)((char)uVar16 + 1);
        } while (bVar4);
      }
      uVar22 = local_168._8_8_ - local_168._0_8_;
      if ((uVar22 & 3) != 0) {
        uVar17 = 0;
        do {
          KDataStream::Read(stream,&local_189);
          uVar17 = uVar17 + 1;
        } while (uVar17 < 4 - ((uint)uVar22 & 3));
      }
      bVar14 = *pKVar23;
      if (bVar14 != 0) {
        pMVar11 = (Minefield_Data_PDU *)0x0;
        pp_Var13 = (_func_int **)local_168._0_8_;
        do {
          local_148 = CONCAT71(local_148._1_7_,*(char *)(local_140._0_8_ + (long)pMVar11));
          if (*(char *)(local_140._0_8_ + (long)pMVar11) != '\0') {
            cVar21 = '\0';
            local_180 = (MinefieldDataFilter *)((long)pMVar11 * 0xe0);
            local_150 = pMVar11;
            do {
              std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::vector
                        (&local_60,(ulong)*(byte *)pp_Var13,(allocator_type *)&local_48);
              for (bVar14 = *(byte *)pp_Var13; bVar14 != 0; bVar14 = bVar14 - 1) {
                DATA_TYPE::Vector::Vector(&local_48,stream);
                std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
                emplace_back<KDIS::DATA_TYPE::Vector>(&local_60,&local_48);
                DATA_TYPE::DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
              }
              DATA_TYPE::Mine::AddTripDetonationWire
                        ((Mine *)((long)&(local_180->super_DataTypeBase)._vptr_DataTypeBase +
                                 (long)(local_170->
                                       super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                                       )._M_impl.super__Vector_impl_data._M_start),&local_60);
              pp_Var13 = (_func_int **)((long)pp_Var13 + 1);
              std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
              ~vector(&local_60);
              cVar21 = cVar21 + '\x01';
            } while (cVar21 != (char)local_148);
            bVar14 = *local_188;
            pMVar11 = local_150;
          }
          pMVar11 = (Minefield_Data_PDU *)
                    ((long)&(pMVar11->super_Minefield_Header).super_Header.super_Header6.
                            _vptr_Header6 + 1);
        } while (pMVar11 < (Minefield_Data_PDU *)(ulong)bVar14);
      }
      if ((_func_int **)local_168._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
      }
      if ((_func_int **)local_140._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_140._0_8_,local_130[0]._M_allocated_capacity - local_140._0_8_
                       );
      }
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_140._0_8_ = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Decode","");
  KException::KException(this_00,(KString *)local_140,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Minefield_Data_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_DATA_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui16SensorTypes.clear();
    m_vMines.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_ReqID
           >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ReqID
           >> m_ui8PduSeqNum
           >> m_ui8NumPdus
           >> m_ui8NumMines
           >> m_ui8NumSensTyp
           >> m_ui8Padding1
           >> KDIS_STREAM m_DataFilter
           >> KDIS_STREAM m_MineTyp;

    // Sensor Types
    KUINT16 ui16SnsTyp = 0;
    KUINT8 i = 0;
    for( i = 0; i < m_ui8NumSensTyp; ++i )
    {
        stream >> ui16SnsTyp;
        m_vui16SensorTypes.push_back( ui16SnsTyp );
    }

    // Padding?
    KUINT8 ui8PaddingNeeded1 = m_ui8NumSensTyp % 2;
    if( ui8PaddingNeeded1 )
    {
        KUINT16 ui16Pad = 0;
        stream >> ui16Pad;
    }

    /************************************************************************/
    /* Mines                                                                */
    /************************************************************************/

    // Create the mines and extract location from stream
    for( i = 0; i < m_ui8NumMines; ++i )
    {
        Mine mn;
        mn.SetLocation( Vector( stream ) );
        m_vMines.push_back( mn );
    }

    // The following are all dependent on the data filter( except ID ):
    if( m_DataFilter.IsGroundBurialDepthOffset() )  MINE_DECODE_NATIVE( KFLOAT32, SetGroundBurialDepthOffsetValue )
        if( m_DataFilter.IsWaterBurialDepthOffset() )   MINE_DECODE_NATIVE( KFLOAT32, SetWaterBurialDepthOffsetValue )
            if( m_DataFilter.IsSnowBurialDepthOffset() )    MINE_DECODE_NATIVE( KFLOAT32, SetSnowBurialDepthOffsetValue )
                if( m_DataFilter.IsMineOrientation() )          MINE_DECODE_CLASS( EulerAngles, SetMineOrientationValue )
                    if( m_DataFilter.IsThermalContrast() )          MINE_DECODE_NATIVE( KFLOAT32, SetThermalContrastValue )
                        if( m_DataFilter.IsReflectance() )              MINE_DECODE_NATIVE( KFLOAT32, SetReflectanceValue )
                            if( m_DataFilter.IsMineEmplacementAge() )       MINE_DECODE_CLASS( ClockTime, SetMineEmplacementAgeValue )
                                MINE_DECODE_NATIVE( KUINT16, SetID )
                                if( m_DataFilter.IsFusing() )                   MINE_DECODE_CLASS( MineFusing, SetFusingValue )

                                    if( m_DataFilter.IsScalarDetectionCoefficient() )
                                    {
                                        for( i = 0; i < m_ui8NumMines; ++i )
                                        {
                                            for( KUINT8 j = 0; j < m_ui8NumSensTyp; ++j )
                                            {
                                                KUINT8 ui8Sdc = 0;
                                                stream >> ui8Sdc;
                                                m_vMines[i].AddScalarDetectionCoefficientValue( ui8Sdc );
                                            }
                                        }
                                    }

    if( m_DataFilter.IsPaintScheme() ) MINE_DECODE_CLASS( MinePaintScheme, SetPaintSchemeValue )

    // Do we need to add padding?
    // Padding � 8{[4 � N(2 F(8) + M F(9) + F(10) + 2)] mod4} bits unused
    KUINT8 ui8PaddingNeeded2 = calcPaddingPaintScheme();
    KUINT8 ui8Pad = 0;
    for( KUINT8 i = 0; i < ui8PaddingNeeded2; ++i )
    {
        stream >> ui8Pad;
    }

    // Trip/Det wires
    if( m_DataFilter.IsTripDetonationWire() )
    {
        // Get the number of trip/det wires
        vector<KUINT8> vNumTripDet( m_ui8NumMines );
        KUINT16 ui16TtlVerts = 0;
        KUINT8 ui8Tmp = 0;
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            stream >> ui8Tmp;
            ui16TtlVerts += ui8Tmp;
            vNumTripDet.push_back( ui8Tmp );
        }

        // Do we need to extract any padding?
        KUINT8 ui8PaddingNeeded = ( 4 - m_ui8NumMines ) % 4;
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Number of vertices's.
        vector<KUINT8> vNumVerts( ui16TtlVerts );
        for( i = 0; i < ui16TtlVerts; ++i )
        {
            stream >> ui8Tmp;
            vNumVerts.push_back( ui8Tmp );
        }

        // More padding?
        ui8PaddingNeeded = ( vNumVerts.size() % 4 == 0 ? 0 : ( 4 - vNumVerts.size() % 4 ) );
        for( i = 0; i < ui8PaddingNeeded; ++i )
        {
            stream >> ui8Pad;
        }

        // Extract all vertices's and place them into the correct mines.
        // For each mine
        vector<KUINT8>::const_iterator citrVert = vNumVerts.begin();
        for( i = 0; i < m_ui8NumMines; ++i )
        {
            // For each wire in the mine
            KUINT8 ui8Loop = vNumTripDet[i];
            for( KUINT8 j = 0; j < ui8Loop; ++j )
            {
                // Get the vertices's.
                vector<Vector> vVerts( *citrVert );
                KUINT8 ui8LoopVerts = *citrVert;
                for( KUINT8 k = 0; k < ui8LoopVerts; ++k )
                {
                    vVerts.push_back( Vector( stream ) );
                }

                // Add the vertices's to the current mine.
                m_vMines[i].AddTripDetonationWire( vVerts );
                ++citrVert;
            }
        }
    }
}